

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall google::protobuf::RepeatedField<bool>::RemoveLast(RepeatedField<bool> *this)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long *plVar7;
  long *__src;
  LongSooRep *this_00;
  LongSooRep *this_01;
  bool bVar8;
  LongSooRep local_30;
  
  uVar1 = (this->soo_rep_).field_0.long_rep.elements_int;
  uVar3 = internal::SooRep::size(&this->soo_rep_,(uVar1 & 4) == 0);
  this_00 = (LongSooRep *)(ulong)uVar3;
  if (0 < (int)uVar3) {
    bVar8 = (uVar1 & 4) == 0;
    elements(this,bVar8);
    iVar4 = internal::SooRep::size(&this->soo_rep_,bVar8);
    if ((iVar4 != uVar3 - 1) &&
       ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) !=
        (undefined1  [16])0x0)) {
      internal::LongSooRep::elements((LongSooRep *)this);
    }
    set_size(this,(uVar1 & 4) == 0,uVar3 - 1);
    return;
  }
  this_01 = &local_30;
  RemoveLast();
  if (this_01 != this_00) {
    uVar1 = this_01->elements_int;
    iVar4 = internal::SooRep::size((SooRep *)this_01,(uVar1 & 4) == 0);
    if (iVar4 != 0) {
      iVar5 = internal::SooRep::size((SooRep *)this_00,(this_00->elements_int & 4) == 0);
      iVar5 = iVar5 + iVar4;
      RepeatedField<long>::Reserve((RepeatedField<long> *)this_00,iVar5);
      uVar2 = this_00->elements_int;
      bVar8 = (uVar2 & 4) == 0;
      plVar7 = RepeatedField<long>::elements((RepeatedField<long> *)this_00,bVar8);
      iVar6 = internal::SooRep::size((SooRep *)this_00,bVar8);
      if ((iVar6 != iVar5) && ((this_00->elements_int & 4) != 0)) {
        internal::LongSooRep::elements(this_00);
      }
      RepeatedField<long>::set_size((RepeatedField<long> *)this_00,(uVar2 & 4) == 0,iVar5);
      __src = RepeatedField<long>::elements((RepeatedField<long> *)this_01,(uVar1 & 4) == 0);
      memcpy(plVar7 + iVar6,__src,(long)iVar4 << 3);
      return;
    }
    return;
  }
  RepeatedField<long>::MergeFrom();
}

Assistant:

inline void RepeatedField<Element>::RemoveLast() {
  const bool is_soo = this->is_soo();
  const int old_size = size(is_soo);
  ABSL_DCHECK_GT(old_size, 0);
  elements(is_soo)[old_size - 1].~Element();
  ExchangeCurrentSize(is_soo, old_size - 1);
}